

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O2

char __thiscall ConnectFourState::get_winner(ConnectFourState *this)

{
  char cVar1;
  int iVar2;
  char cVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  pointer pvVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  pointer pvVar15;
  long lVar16;
  long lVar17;
  
  uVar8 = this->last_col;
  lVar4 = (long)(int)uVar8;
  if (-1 < lVar4) {
    uVar9 = this->last_row;
    uVar5 = (ulong)uVar9;
    lVar12 = (long)(int)uVar9;
    pvVar11 = (this->board).
              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar16 = *(long *)&pvVar11[lVar12].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data;
    pcVar10 = (char *)(lVar16 + lVar4);
    cVar1 = *pcVar10;
    uVar6 = 0;
    while ((pcVar10 = pcVar10 + -1, uVar7 = uVar8, uVar8 != uVar6 &&
           (uVar7 = uVar6, *pcVar10 == cVar1))) {
      uVar6 = uVar6 + 1;
    }
    iVar2 = this->num_cols;
    for (lVar14 = lVar4;
        (uVar7 = uVar7 + 1, (int)lVar14 + 1 < iVar2 && (*(char *)(lVar16 + 1 + lVar14) == cVar1));
        lVar14 = lVar14 + 1) {
    }
    cVar3 = cVar1;
    if (uVar7 < 4) {
      pvVar15 = pvVar11 + uVar5;
      uVar6 = 1;
      uVar8 = uVar9;
      while ((pvVar15 = pvVar15 + -1, 0 < (int)uVar8 &&
             (*(char *)(*(long *)&(pvVar15->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                                  .super__Vector_impl_data + lVar4) == cVar1))) {
        uVar6 = uVar6 + 1;
        uVar8 = uVar8 - 1;
      }
      lVar14 = (long)this->num_rows;
      pvVar15 = pvVar11 + lVar12;
      lVar16 = lVar12;
      while( true ) {
        lVar16 = lVar16 + 1;
        pvVar15 = pvVar15 + 1;
        if ((lVar14 <= lVar16) ||
           (*(char *)(*(long *)&(pvVar15->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data + lVar4) != cVar1)) break;
        uVar6 = uVar6 + 1;
      }
      if (uVar6 < 4) {
        pvVar15 = pvVar11 + uVar5;
        uVar8 = 1;
        for (lVar16 = lVar4;
            ((pvVar15 = pvVar15 + -1, 0 < (int)uVar9 && (0 < (int)lVar16)) &&
            (*(char *)(*(long *)&(pvVar15->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data + -1 + lVar16) == cVar1));
            lVar16 = lVar16 + -1) {
          uVar8 = uVar8 + 1;
          uVar9 = uVar9 - 1;
        }
        pvVar15 = pvVar11 + lVar12;
        lVar16 = lVar4;
        lVar17 = lVar12;
        while( true ) {
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 1;
          pvVar15 = pvVar15 + 1;
          if (((lVar14 <= lVar17) || (iVar2 <= (int)lVar16)) ||
             (*(char *)(*(long *)&(pvVar15->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                                  .super__Vector_impl_data + lVar16) != cVar1)) break;
          uVar8 = uVar8 + 1;
        }
        if (uVar8 < 4) {
          pvVar15 = pvVar11 + lVar12;
          uVar13 = 1;
          for (lVar16 = lVar4;
              ((pvVar15 = pvVar15 + 1, (long)(lVar12 + uVar13) < lVar14 && (0 < (int)lVar16)) &&
              (*(char *)(*(long *)&(pvVar15->super__Vector_base<char,_std::allocator<char>_>).
                                   _M_impl.super__Vector_impl_data + -1 + lVar16) == cVar1));
              lVar16 = lVar16 + -1) {
            uVar13 = uVar13 + 1;
          }
          pvVar11 = pvVar11 + uVar5;
          while( true ) {
            pvVar11 = pvVar11 + -1;
            lVar4 = lVar4 + 1;
            if ((((int)uVar5 < 1) || (iVar2 <= (int)lVar4)) ||
               (*(char *)(*(long *)&(pvVar11->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data + lVar4) != cVar1)) break;
            uVar5 = (ulong)((int)uVar5 - 1);
            uVar13 = (ulong)((uint)uVar13 + 1);
          }
          cVar3 = '.';
          if (3 < (uint)uVar13) {
            cVar3 = cVar1;
          }
        }
      }
    }
    return cVar3;
  }
  return '.';
}

Assistant:

char get_winner() const
	{
		if (last_col < 0) {
			return player_markers[0];
		}

		// We only need to check around the last piece played.
		auto piece = board[last_row][last_col];

		// X X X X
		int left = 0, right = 0;
		for (int col = last_col - 1; col >= 0 && board[last_row][col] == piece; --col) left++;
		for (int col = last_col + 1; col < num_cols && board[last_row][col] == piece; ++col) right++;
		if (left + 1 + right >= 4) {
			return piece;
		}

		// X
		// X
		// X
		// X
		int up = 0, down = 0;
		for (int row = last_row - 1; row >= 0 && board[row][last_col] == piece; --row) up++;
		for (int row = last_row + 1; row < num_rows && board[row][last_col] == piece; ++row) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		// X
		//  X
		//   X
		//    X
		up = 0;
		down = 0;
		for (int row = last_row - 1, col = last_col - 1; row >= 0 && col >= 0 && board[row][col] == piece; --row, --col) up++;
		for (int row = last_row + 1, col = last_col + 1; row < num_rows && col < num_cols && board[row][col] == piece; ++row, ++col) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		//    X
		//   X
		//  X
		// X
		up = 0;
		down = 0;
		for (int row = last_row + 1, col = last_col - 1; row < num_rows && col >= 0 && board[row][col] == piece; ++row, --col) up++;
		for (int row = last_row - 1, col = last_col + 1; row >= 0 && col < num_cols && board[row][col] == piece; --row, ++col) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		return player_markers[0];
	}